

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uint stbi__zreceive(stbi__zbuf *z,int n)

{
  uint uVar1;
  int in_ESI;
  long in_RDI;
  uint k;
  
  if (*(int *)(in_RDI + 0x10) < in_ESI) {
    stbi__fill_bits((stbi__zbuf *)0x113185);
  }
  uVar1 = *(uint *)(in_RDI + 0x14);
  *(uint *)(in_RDI + 0x14) = *(uint *)(in_RDI + 0x14) >> ((byte)in_ESI & 0x1f);
  *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) - in_ESI;
  return uVar1 & (1 << ((byte)in_ESI & 0x1f)) - 1U;
}

Assistant:

stbi_inline static unsigned int stbi__zreceive(stbi__zbuf *z, int n)
{
   unsigned int k;
   if (z->num_bits < n) stbi__fill_bits(z);
   k = z->code_buffer & ((1 << n) - 1);
   z->code_buffer >>= n;
   z->num_bits -= n;
   return k;
}